

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void test_query_permission_granted_callback(ne_core_permission_event *event,void *user_data)

{
  ne_core_permission_state nVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  byte bVar4;
  
  uVar2 = event->permission;
  uVar3 = *(uint64_t *)((long)user_data + 8);
  if (uVar2 != uVar3) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x200,"TEST_EXPECT(event->permission == table->permission) failed\n");
  }
  bVar4 = uVar2 == uVar3 & *(byte *)((long)user_data + 0x48);
  *(byte *)((long)user_data + 0x48) = bVar4;
  if (event->current_state != ne_core_permission_state_granted) {
    bVar4 = 0;
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x201,
                     "TEST_EXPECT(event->current_state == ne_core_permission_state_granted) failed\n"
                    );
  }
  *(byte *)((long)user_data + 0x48) = bVar4;
  nVar1 = event->previous_state;
  if (nVar1 != ne_core_permission_state_prompt) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x202,
                     "TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt) failed\n"
                    );
    bVar4 = *(byte *)((long)user_data + 0x48);
  }
  *(byte *)((long)user_data + 0x48) = nVar1 == ne_core_permission_state_prompt & bVar4;
  *(undefined8 *)((long)user_data + 0x38) = 1;
  if (*(undefined8 **)((long)user_data + 0x40) != (undefined8 *)0x0) {
    **(undefined8 **)((long)user_data + 0x40) = 0;
  }
  (**(code **)((long)user_data + 0x18))(user_data);
  if (*(undefined8 **)((long)user_data + 0x40) != (undefined8 *)0x0) {
    **(undefined8 **)((long)user_data + 0x40) = 0;
  }
  (**(code **)((long)user_data + 0x28))();
  return;
}

Assistant:

static void test_query_permission_granted_callback(
    const ne_core_permission_event *event, const void *user_data)
{
  auto table = static_cast<test_table *>(const_cast<void *>(user_data));
  TEST_EXPECT(event->permission == table->permission);
  TEST_EXPECT(event->current_state == ne_core_permission_state_granted);
  TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt);

  // We got permission so run both full and shared tests.
  TEST_CLEAR_RESULT();
  table->expected_result = NE_CORE_RESULT_SUCCESS;
  test_full(table);
}